

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O1

void __thiscall TCLAP::StdOutput::failure(StdOutput *this,CmdLineInterface *_cmd,ArgException *e)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer pcVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  undefined4 *puVar6;
  string progName;
  string local_90;
  long *local_70;
  long local_68;
  long local_60 [2];
  char *local_50;
  long local_48;
  char local_40 [16];
  
  iVar4 = (*_cmd->_vptr_CmdLineInterface[10])(_cmd);
  local_50 = local_40;
  lVar2 = *(long *)CONCAT44(extraout_var,iVar4);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar2,((long *)CONCAT44(extraout_var,iVar4))[1] + lVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"PARSE ERROR: ",0xd);
  ArgException::argId_abi_cxx11_(&local_90,e);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"             ",0xd);
  pcVar3 = (e->_errorText)._M_dataplus._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (e->_errorText)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_70,local_68);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  paVar1 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT53(local_90.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_90.field_2._M_local_buf[2],
                                      local_90.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  iVar4 = (*_cmd->_vptr_CmdLineInterface[0xf])(_cmd);
  if ((char)iVar4 == '\0') {
    (*(this->super_CmdLineOutput)._vptr_CmdLineOutput[2])(this,_cmd);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Brief USAGE: ",0xd);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    _shortUsage(this,_cmd,(ostream *)&std::cerr);
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"For complete USAGE and HELP type: ",0x22);
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"   ",3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    local_90.field_2._M_allocated_capacity._0_2_ = 0x2d2d;
    local_90._M_string_length = 2;
    local_90.field_2._M_local_buf[2] = '\0';
    local_90._M_dataplus._M_p = (pointer)paVar1;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,paVar1->_M_local_buf,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"help",4);
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT53(local_90.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_90.field_2._M_local_buf[2],
                                        local_90.field_2._M_allocated_capacity._0_2_)) + 1);
    }
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 1;
  __cxa_throw(puVar6,&ExitException::typeinfo,0);
}

Assistant:

inline void StdOutput::failure( CmdLineInterface& _cmd,
								ArgException& e ) 
{
	std::string progName = _cmd.getProgramName();

	std::cerr << "PARSE ERROR: " << e.argId() << std::endl
		      << "             " << e.error() << std::endl << std::endl;

	if ( _cmd.hasHelpAndVersion() )
		{
			std::cerr << "Brief USAGE: " << std::endl;

			_shortUsage( _cmd, std::cerr );	

			std::cerr << std::endl << "For complete USAGE and HELP type: " 
					  << std::endl << "   " << progName << " "
					  << Arg::nameStartString() << "help"
					  << std::endl << std::endl;
		}
	else
		usage(_cmd);

	throw ExitException(1);
}